

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

void embree::error_handler(void *userPtr,RTCError code,char *str)

{
  undefined8 uVar1;
  
  if (code == RTC_ERROR_NONE) {
    return;
  }
  uVar1 = rtcGetErrorString(code);
  printf("Embree: %s",uVar1);
  if (str == (char *)0x0) {
    putchar(10);
  }
  else {
    printf(" (");
    for (; *str != '\0'; str = str + 1) {
      putchar((int)*str);
    }
    puts(")");
  }
  exit(1);
}

Assistant:

void error_handler(void* userPtr, const RTCError code, const char* str)
  {
    if (code == RTC_ERROR_NONE)
      return;

    printf("Embree: %s", rtcGetErrorString(code));
    if (str) {
      printf(" (");
      while (*str) putchar(*str++);
      printf(")\n");
    } else {
      printf("\n");
    }
    exit(1);
  }